

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::base_internal::anon_unknown_0::ArenaLock::ArenaLock
          (ArenaLock *this,Arena *arena)

{
  int iVar1;
  sigset_t all;
  sigset_t local_90;
  
  this->left_ = false;
  this->mask_valid_ = false;
  this->arena_ = arena;
  if ((arena->flags & 2) != 0) {
    sigfillset(&local_90);
    iVar1 = pthread_sigmask(0,&local_90,(__sigset_t *)&this->mask_);
    this->mask_valid_ = iVar1 == 0;
    arena = this->arena_;
  }
  SpinLock::Lock(&arena->mu);
  return;
}

Assistant:

arena_(arena) {
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
    if ((arena->flags & LowLevelAlloc::kAsyncSignalSafe) != 0) {
      sigset_t all;
      sigfillset(&all);
      mask_valid_ = pthread_sigmask(SIG_BLOCK, &all, &mask_) == 0;
    }
#endif
    arena_->mu.Lock();
  }